

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.cpp
# Opt level: O2

void __thiscall wasm::Thread::~Thread(Thread *this)

{
  std::mutex::lock(&this->mutex);
  this->done = true;
  std::condition_variable::notify_one();
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  std::thread::join();
  std::_Function_base::~_Function_base(&(this->doWork).super__Function_base);
  std::condition_variable::~condition_variable(&this->condition);
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr(&this->thread);
  return;
}

Assistant:

Thread::~Thread() {
  {
    std::lock_guard<std::mutex> lock(mutex);
    // notify the thread that it can exit
    done = true;
    condition.notify_one();
  }
  thread->join();
}